

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minicrypto.c
# Opt level: O3

int main(int argc,char **argv)

{
  st_ptls_ffx_test_variants_t *psVar1;
  int iVar2;
  st_ptls_ffx_test_variants_t *psVar3;
  ptls_iovec_t cert;
  ptls_minicrypto_secp256r1sha256_sign_certificate_t sign_certificate;
  ptls_iovec_t local_100;
  ptls_sign_certificate_t local_f0;
  char local_e8 [32];
  ptls_context_t local_c8;
  
  subtest("secp256r1",test_secp256r1_key_exchange);
  subtest("x25519",test_x25519_key_exchange);
  subtest("secp256r1-sign",test_secp256r1_sign);
  local_c8.certificates.list = &local_100;
  local_100.base = (uint8_t *)anon_var_dwarf_22d14;
  local_100.len = 0x264;
  local_c8.sign_certificate = &local_f0;
  local_f0.cb = secp256r1sha256_sign;
  local_e8[0] = -0x3f;
  local_e8[1] = 't';
  local_e8[2] = -0x4c;
  local_e8[3] = -7;
  local_e8[4] = '^';
  local_e8[5] = -2;
  local_e8[6] = 'z';
  local_e8[7] = '\x01';
  local_e8[8] = '\x0e';
  local_e8[9] = -0x42;
  local_e8[10] = 'J';
  local_e8[0xb] = -0x18;
  local_e8[0xc] = '3';
  local_e8[0xd] = -0x4e;
  local_e8[0xe] = '6';
  local_e8[0xf] = '\x13';
  local_e8[0x10] = -4;
  local_e8[0x11] = 'e';
  local_e8[0x12] = -0x17;
  local_e8[0x13] = 'e';
  local_e8[0x14] = -0x6f;
  local_e8[0x15] = -0x58;
  local_e8[0x16] = '9';
  local_e8[0x17] = -0x62;
  local_e8[0x18] = -0x66;
  local_e8[0x19] = -0x80;
  local_e8[0x1a] = -5;
  local_e8[0x1b] = -0x55;
  local_e8[0x1c] = -0x2f;
  local_e8[0x1d] = -1;
  local_e8[0x1e] = -0x46;
  local_e8[0x1f] = ':';
  ctx_peer = &local_c8;
  local_c8.random_bytes = ptls_minicrypto_random_bytes;
  local_c8.get_time = &ptls_get_time;
  local_c8.key_exchanges = ptls_minicrypto_key_exchanges;
  local_c8.cipher_suites = ptls_minicrypto_cipher_suites;
  local_c8.certificates.count = 1;
  local_c8.esni = (ptls_esni_context_t **)0x0;
  local_c8.on_client_hello = (ptls_on_client_hello_t *)0x0;
  local_c8.emit_certificate = (ptls_emit_certificate_t *)0x0;
  local_c8.verify_certificate = (ptls_verify_certificate_t *)0x0;
  local_c8.ticket_lifetime._0_1_ = 0;
  local_c8._89_7_ = 0;
  local_c8.hkdf_label_prefix__obsolete._0_1_ = 0;
  local_c8._97_8_ = 0;
  local_c8.encrypt_ticket = (ptls_encrypt_ticket_t *)0x0;
  local_c8.save_ticket = (ptls_save_ticket_t *)0x0;
  local_c8.log_event = (ptls_log_event_t *)0x0;
  local_c8.update_open_count = (ptls_update_open_count_t *)0x0;
  local_c8.update_traffic_key = (ptls_update_traffic_key_t *)0x0;
  local_c8.decompress_certificate = (ptls_decompress_certificate_t *)0x0;
  local_c8.update_esni_key = (ptls_update_esni_key_t *)0x0;
  local_c8.pkey_buf.base = (uint8_t *)0x0;
  local_c8.pkey_buf.len = 0;
  local_c8.on_extension = (ptls_on_extension_t *)0x0;
  local_c8.private_key_method = (ptls_private_key_method_t *)0x0;
  psVar1 = ffx_variants;
  do {
    psVar3 = psVar1;
    psVar1 = psVar3 + 1;
  } while (psVar3->algo != (ptls_cipher_algorithm_t *)0x0);
  ctx = ctx_peer;
  psVar3->algo = &ptls_ffx_ptls_minicrypto_aes128ctr_b125_r8;
  psVar3->bit_length = 0x7d;
  psVar1 = ffx_variants;
  do {
    psVar3 = psVar1;
    psVar1 = psVar3 + 1;
  } while (psVar3->algo != (ptls_cipher_algorithm_t *)0x0);
  psVar3->algo = &ptls_ffx_ptls_minicrypto_aes128ctr_b31_r6;
  psVar3->bit_length = 0x1f;
  psVar1 = ffx_variants;
  do {
    psVar3 = psVar1;
    psVar1 = psVar3 + 1;
  } while (psVar3->algo != (ptls_cipher_algorithm_t *)0x0);
  psVar3->algo = &ptls_ffx_ptls_minicrypto_aes128ctr_b53_r4;
  psVar3->bit_length = 0x35;
  psVar1 = ffx_variants;
  do {
    psVar3 = psVar1;
    psVar1 = psVar3 + 1;
  } while (psVar3->algo != (ptls_cipher_algorithm_t *)0x0);
  psVar3->algo = &ptls_ffx_ptls_minicrypto_chacha20_b256_r8;
  psVar3->bit_length = 0x100;
  psVar1 = ffx_variants;
  do {
    psVar3 = psVar1;
    psVar1 = psVar3 + 1;
  } while (psVar3->algo != (ptls_cipher_algorithm_t *)0x0);
  psVar3->algo = &ptls_ffx_ptls_minicrypto_chacha20_b32_r6;
  psVar3->bit_length = 0x20;
  psVar1 = ffx_variants;
  do {
    psVar3 = psVar1;
    psVar1 = psVar3 + 1;
  } while (psVar3->algo != (ptls_cipher_algorithm_t *)0x0);
  psVar3->algo = &ptls_ffx_ptls_minicrypto_chacha20_b57_r4;
  psVar3->bit_length = 0x39;
  subtest("picotls",test_picotls);
  subtest("hrr",test_hrr);
  iVar2 = done_testing();
  return iVar2;
}

Assistant:

int main(int argc, char **argv)
{
    subtest("secp256r1", test_secp256r1_key_exchange);
    subtest("x25519", test_x25519_key_exchange);
    subtest("secp256r1-sign", test_secp256r1_sign);

    ptls_iovec_t cert = ptls_iovec_init(SECP256R1_CERTIFICATE, sizeof(SECP256R1_CERTIFICATE) - 1);

    ptls_minicrypto_secp256r1sha256_sign_certificate_t sign_certificate;
    ptls_minicrypto_init_secp256r1sha256_sign_certificate(&sign_certificate,
                                                          ptls_iovec_init(SECP256R1_PRIVATE_KEY, SECP256R1_PRIVATE_KEY_SIZE));

    ptls_context_t ctxbuf = {ptls_minicrypto_random_bytes,
                             &ptls_get_time,
                             ptls_minicrypto_key_exchanges,
                             ptls_minicrypto_cipher_suites,
                             {&cert, 1},
                             NULL,
                             NULL,
                             NULL,
                             &sign_certificate.super};
    ctx = ctx_peer = &ctxbuf;
    ADD_FFX_AES128_ALGORITHMS(minicrypto);
    ADD_FFX_CHACHA20_ALGORITHMS(minicrypto);

    subtest("picotls", test_picotls);
    subtest("hrr", test_hrr);

    return done_testing();
    return done_testing();
}